

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void basic_example(void)

{
  shared_ptr<spdlog::logger> my_logger;
  allocator local_69;
  string local_68 [39];
  undefined1 in_stack_ffffffffffffffbf;
  filename_t *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"file_logger",(allocator *)&stack0xffffffffffffffcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"logs/basic-log.txt",&local_69);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10ddaf);
  return;
}

Assistant:

void basic_example()
{
    // Create basic file logger (not rotated).
    auto my_logger = spdlog::basic_logger_mt("file_logger", "logs/basic-log.txt");
}